

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_1::PosixFileLock::~PosixFileLock(PosixFileLock *this)

{
  long lVar1;
  PosixFileLock *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~PosixFileLock(in_RDI);
  operator_delete(in_RDI,0x30);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixFileLock(int fd, std::string filename)
      : fd_(fd), filename_(std::move(filename)) {}